

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanEmdeBoasTree.cpp
# Opt level: O3

int __thiscall VanEmdeBoasTree::remove(VanEmdeBoasTree *this,char *__filename)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int in_EDX;
  undefined7 uVar5;
  Node *this_00;
  double dVar6;
  double dVar7;
  
  this_00 = *(Node **)__filename;
  if ((((in_EDX < 0 || this_00 == (Node *)0x0) || (iVar4 = this_00->uni, iVar4 <= in_EDX)) ||
      (in_EDX < this_00->min)) || (iVar1 = this_00->max, iVar1 < in_EDX)) {
    return 0;
  }
  uVar5 = (undefined7)((ulong)this >> 8);
  if (this_00->min != in_EDX) {
LAB_00107c4d:
    if (2 < iVar4) {
      dVar6 = log2((double)iVar4);
      dVar6 = floor(dVar6 * 0.5);
      dVar6 = exp2(dVar6);
      lVar3 = *(long *)(*(int **)__filename + 8);
      dVar7 = log2((double)**(int **)__filename);
      dVar7 = floor(dVar7 * 0.5);
      exp2(dVar7);
      iVar4 = remove(this,(char *)((long)(int)((float)in_EDX / (float)dVar6) * 8 + lVar3));
      if ((char)iVar4 == '\0') {
        return 0;
      }
      this_00 = *(Node **)__filename;
      if (this_00->cluster[(int)((float)in_EDX / (float)dVar6)] == (Node *)0x0) {
        iVar4 = remove(this,(char *)&this_00->summary);
        if ((char)iVar4 == '\0') {
          return 0;
        }
        this_00 = *(Node **)__filename;
      }
    }
    iVar4 = (int)CONCAT71(uVar5,1);
    if (this_00->max == in_EDX) {
      if (this_00->summary != (Node *)0x0) {
        iVar1 = this_00->summary->max;
        if ((long)iVar1 != -0x80000000) {
          iVar2 = this_00->cluster[iVar1]->max;
          dVar6 = log2((double)this_00->uni);
          dVar6 = floor(dVar6 * 0.5);
          dVar6 = exp2(dVar6);
          *(int *)(*(long *)__filename + 0x14) = (int)((float)dVar6 * (float)iVar1 + (float)iVar2);
          return iVar4;
        }
      }
      this_00->max = this_00->min;
    }
    return iVar4;
  }
  if (this_00->summary != (Node *)0x0) {
    iVar2 = this_00->summary->min;
    if ((long)iVar2 != -0x80000000) {
      iVar1 = this_00->cluster[iVar2]->min;
      dVar6 = log2((double)iVar4);
      dVar6 = floor(dVar6 * 0.5);
      dVar6 = exp2(dVar6);
      in_EDX = (int)((float)dVar6 * (float)iVar2 + (float)iVar1);
      this_00 = *(Node **)__filename;
      this_00->min = in_EDX;
      iVar4 = this_00->uni;
      goto LAB_00107c4d;
    }
  }
  if (iVar1 == in_EDX) {
    this_00->min = -0x80000000;
    this_00->max = -0x80000000;
    Node::~Node(this_00);
    operator_delete(this_00,0x28);
    __filename[0] = '\0';
    __filename[1] = '\0';
    __filename[2] = '\0';
    __filename[3] = '\0';
    __filename[4] = '\0';
    __filename[5] = '\0';
    __filename[6] = '\0';
    __filename[7] = '\0';
  }
  else {
    this_00->min = iVar1;
  }
  return (int)CONCAT71(uVar5,1);
}

Assistant:

bool VanEmdeBoasTree::remove(Node *&root, int value) {
    if (!root) {
        return false;
    }

    if (value < 0 || value >= root->uni) {
        return false;
    }
    if (root->min > value || root->max < value) {
        return false;
    }

    if (root->min == value) {
        int i;
        if (!findMin(root->summary, i) || i == INT_MIN) {
            if (root->min != root->max) {
                root->min = root->max;
                return true;
            }

            root->min = root->max = INT_MIN;
            delete root;
            root = nullptr;
            return true;
        }
        value = root->min = index(root, i, root->cluster[i]->min);
    }

    if (root->uni > 2) {
        int highVal = high(root, value);
        if (!remove(root->cluster[highVal], low(root, value))) {
            return false;
        }

        int tmp;
        if (!findMin(root->cluster[highVal], tmp) || tmp == INT_MIN) {
            if (!remove(root->summary, highVal)) {
                return false;
            }
        }
    }

    if (root->max == value) {
        int tmp;
        if (!findMax(root->summary, tmp) || tmp == INT_MIN) {
            root->max = root->min;
        } else {
            int i;
            if (!findMax(root->summary, i)) {
                return false;
            }
            root->max = index(root, i, root->cluster[i]->max);
        }
    }
    return true;
}